

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::Opnd::DumpValueType(Opnd *this)

{
  StackSym *this_00;
  bool bVar1;
  OpndKind OVar2;
  AddrOpndKind AVar3;
  uint uVar4;
  RegOpnd *pRVar5;
  AddrOpnd *pAVar6;
  Var local_48;
  Var address;
  AddrOpnd *addrOpnd;
  StackSym *sym;
  Opnd *this_local;
  
  bVar1 = ValueType::IsUninitialized(&this->m_valueType);
  if (!bVar1) {
    if ((DAT_01ec73ca & 1) == 0) {
      OVar2 = GetKind(this);
      uVar4 = (uint)OVar2;
      if (uVar4 - 1 < 3) {
        return;
      }
      if (uVar4 == 8) {
        pRVar5 = AsRegOpnd(this);
        this_00 = pRVar5->m_sym;
        if (this_00 != (StackSym *)0x0) {
          bVar1 = StackSym::IsInt32(this_00);
          if (bVar1) {
            return;
          }
          bVar1 = StackSym::IsFloat32(this_00);
          if (bVar1) {
            return;
          }
          bVar1 = StackSym::IsFloat64(this_00);
          if (bVar1) {
            return;
          }
          bVar1 = StackSym::IsInt64(this_00);
          if (bVar1) {
            return;
          }
          bVar1 = StackSym::IsUint64(this_00);
          if (bVar1) {
            return;
          }
        }
      }
      else if ((uVar4 == 9) && (pAVar6 = AsAddrOpnd(this), pAVar6->m_address != (Var)0x0)) {
        pAVar6 = AsAddrOpnd(this);
        bVar1 = AddrOpnd::IsVar(pAVar6);
        if (bVar1) {
          pAVar6 = AsAddrOpnd(this);
          if (pAVar6->decodedValue == (Var)0x0) {
            local_48 = pAVar6->m_address;
          }
          else {
            local_48 = pAVar6->decodedValue;
          }
          AVar3 = AddrOpnd::GetAddrOpndKind(pAVar6);
          if (AVar3 == AddrOpndKindConstantVar) {
            return;
          }
          bVar1 = Js::TaggedInt::Is(local_48);
          if (bVar1) {
            return;
          }
          bVar1 = Js::JavascriptNumber::Is_NoTaggedIntCheck(local_48);
          if (bVar1) {
            return;
          }
        }
      }
    }
    DumpValueType((ValueType)
                  *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this->m_valueType).field_0.field_0)
    ;
  }
  return;
}

Assistant:

void Opnd::DumpValueType()
{
    if(m_valueType.IsUninitialized())
    {
        return;
    }

    if(!CONFIG_FLAG(Verbose))
    {
        // Skip printing the value type when it's obvious since verbose mode is off
        switch(this->GetKind())
        {
        case OpndKindIntConst:
        case OpndKindInt64Const:
        case OpndKindFloatConst:
            return;

        case OpndKindReg:
            {
                StackSym *const sym = this->AsRegOpnd()->m_sym;
                if(sym && (
                    sym->IsInt32() ||
                    sym->IsFloat32() ||
                    sym->IsFloat64() ||
                    sym->IsInt64() ||
                    sym->IsUint64()
                    ))
                {
                    return;
                }
                break;
            }

        case OpndKindAddr:
            if(this->AsAddrOpnd()->m_address && this->AsAddrOpnd()->IsVar())
            {
                IR::AddrOpnd *addrOpnd = this->AsAddrOpnd();
                Js::Var address = addrOpnd->decodedValue ? addrOpnd->decodedValue : addrOpnd->m_address;

                // Tagged int might be encoded here, so check the type
                if (addrOpnd->GetAddrOpndKind() == AddrOpndKindConstantVar
                    || Js::TaggedInt::Is(address) || (
#if !FLOATVAR
                    !JITManager::GetJITManager()->IsOOPJITEnabled() &&
#endif
                    Js::JavascriptNumber::Is_NoTaggedIntCheck(address)))
                {
                    return;
                }
            }
            break;
        }
    }

    DumpValueType(m_valueType);
}